

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::setExternalSchemaLocation
          (AbstractDOMParser *this,XMLCh *schemaLocation)

{
  XMLCh *schemaLocation_local;
  AbstractDOMParser *this_local;
  
  XMLScanner::setExternalSchemaLocation(this->fScanner,schemaLocation);
  return;
}

Assistant:

void AbstractDOMParser::setExternalSchemaLocation(const XMLCh* const schemaLocation)
{
    fScanner->setExternalSchemaLocation(schemaLocation);
}